

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O0

int pt_encode_ip(pt_encoder *encoder,pt_opcode op,pt_packet_ip *packet)

{
  byte *pbVar1;
  int size_00;
  uint8_t *puVar2;
  int errcode;
  int size;
  uint8_t ipc;
  uint8_t opc;
  uint8_t *pos;
  pt_packet_ip *packet_local;
  pt_opcode op_local;
  pt_encoder *encoder_local;
  
  if ((encoder == (pt_encoder *)0x0) || (packet == (pt_packet_ip *)0x0)) {
    encoder_local._4_4_ = 1;
  }
  else {
    size_00 = pt_ipc_size(packet->ipc);
    encoder_local._4_4_ = size_00;
    if ((-1 < size_00) &&
       (encoder_local._4_4_ = pt_reserve(encoder,size_00 + 1), -1 < encoder_local._4_4_)) {
      pbVar1 = encoder->pos;
      *pbVar1 = (byte)op | (byte)(packet->ipc << 5);
      puVar2 = pt_encode_int(pbVar1 + 1,packet->ip,size_00);
      encoder->pos = puVar2;
      encoder_local._4_4_ = size_00 + 1;
    }
  }
  return encoder_local._4_4_;
}

Assistant:

static int pt_encode_ip(struct pt_encoder *encoder, enum pt_opcode op,
			const struct pt_packet_ip *packet)
{
	uint8_t *pos;
	uint8_t opc, ipc;
	int size, errcode;

	if (!encoder || !packet)
		return pte_internal;

	size = pt_ipc_size(packet->ipc);
	if (size < 0)
		return size;

	errcode = pt_reserve(encoder,
			     /* opc size = */ 1u + (unsigned int) size);
	if (errcode < 0)
		return errcode;

	/* We already checked the ipc in pt_ipc_size(). */
	ipc = (uint8_t) (packet->ipc << pt_opm_ipc_shr);
	opc = (uint8_t) op;

	pos = encoder->pos;
	*pos++ = opc | ipc;

	encoder->pos = pt_encode_int(pos, packet->ip, size);
	return /* opc size = */ 1 + size;
}